

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSampler_Test::TestBody
          (Sampler_testProbabilisticSampler_Test *this)

{
  bool bVar1;
  char *pcVar2;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *pvVar3;
  size_type sVar4;
  const_reference pvVar5;
  AssertionResult local_5f8 [2];
  AssertHelper local_5d8 [8];
  Message local_5d0 [15];
  bool local_5c1;
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar__3;
  string local_5a8;
  TraceID local_588;
  SamplingStatus local_578;
  AssertionResult local_558 [2];
  AssertHelper local_538 [8];
  Message local_530 [15];
  bool local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar__2;
  string local_508;
  TraceID local_4e8;
  undefined1 local_4d8 [8];
  SamplingStatus result_1;
  ProbabilisticSampler sampler_1;
  Message local_480 [8];
  undefined1 local_478 [8];
  AssertionResult gtest_ar_3;
  Tag thriftTagVec_1;
  Tag local_3d8 [8];
  Tag thriftTagArr_1;
  ulong local_348;
  size_t i_1;
  Message local_338 [8];
  size_type local_330;
  unsigned_long local_328;
  undefined1 local_320 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_2f0 [8];
  Message local_2e8 [15];
  bool local_2d9;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar__1;
  string local_2c0;
  TraceID local_2a0;
  SamplingStatus local_290;
  AssertHelper local_270 [8];
  Message local_268 [8];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  Tag thriftTagVec;
  Tag local_1c0 [8];
  Tag thriftTagArr;
  ulong local_130;
  size_t i;
  Message local_120 [8];
  size_type local_118;
  unsigned_long local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar;
  AssertionResult local_f0 [2];
  AssertHelper local_d0 [8];
  Message local_c8 [15];
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  string local_a0;
  TraceID local_70;
  undefined1 local_60 [8];
  SamplingStatus result;
  ProbabilisticSampler sampler;
  Sampler_testProbabilisticSampler_Test *this_local;
  
  ProbabilisticSampler::ProbabilisticSampler
            ((ProbabilisticSampler *)
             &result._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.5);
  TraceID::TraceID(&local_70,0,0x800000000000000a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"op",(allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  ProbabilisticSampler::isSampled
            ((SamplingStatus *)local_60,
             (ProbabilisticSampler *)
             &result._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_70,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = SamplingStatus::isSampled((SamplingStatus *)local_60);
  local_b9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_f0,local_b8,"result.isSampled()","true");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(local_d0,local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    testing::Message::~Message(local_c8);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    local_110 = 2;
    pvVar3 = SamplingStatus::tags((SamplingStatus *)local_60);
    local_118 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size(pvVar3);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_108,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)",
               "(result.tags()).size()",&local_110,&local_118);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
    if (!bVar1) {
      testing::Message::Message(local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&i,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x77,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&i,local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
      testing::Message::~Message(local_120);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      local_130 = 0;
      while( true ) {
        pvVar3 = SamplingStatus::tags((SamplingStatus *)local_60);
        sVar4 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size(pvVar3);
        if (sVar4 <= local_130) break;
        thrift::Tag::Tag(local_1c0);
        thrift::Tag::Tag((Tag *)&gtest_ar_1.message_);
        jaegertracing::Tag::thrift
                  ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags + local_130 * 0x48));
        pvVar3 = SamplingStatus::tags((SamplingStatus *)local_60);
        pvVar5 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::operator[]
                           (pvVar3,local_130);
        jaegertracing::Tag::thrift((Tag *)pvVar5);
        testing::internal::EqHelper<false>::
        Compare<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                  ((EqHelper<false> *)local_260,"thriftTagArr","thriftTagVec",local_1c0,
                   (Tag *)&gtest_ar_1.message_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
        if (!bVar1) {
          testing::Message::Message(local_268);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
          testing::internal::AssertHelper::AssertHelper
                    (local_270,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x77,pcVar2);
          testing::internal::AssertHelper::operator=(local_270,local_268);
          testing::internal::AssertHelper::~AssertHelper(local_270);
          testing::Message::~Message(local_268);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          gtest_ar.message_.ptr_._4_4_ = 0;
        }
        jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_1.message_);
        jaegertracing::thrift::Tag::~Tag(local_1c0);
        if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_00300200;
        local_130 = local_130 + 1;
      }
      TraceID::TraceID(&local_2a0,0,0x7fffffffffffffec);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2c0,"op",(allocator *)((long)&gtest_ar__1.message_.ptr_ + 7));
      ProbabilisticSampler::isSampled
                (&local_290,
                 (ProbabilisticSampler *)
                 &result._tags.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a0,&local_2c0);
      SamplingStatus::operator=((SamplingStatus *)local_60,&local_290);
      SamplingStatus::~SamplingStatus(&local_290);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__1.message_.ptr_ + 7));
      local_2d9 = SamplingStatus::isSampled((SamplingStatus *)local_60);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2d8,&local_2d9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
      if (!bVar1) {
        testing::Message::Message(local_2e8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)&gtest_ar_2.message_,local_2d8,"result.isSampled()","false");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_2f0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x7b,pcVar2);
        testing::internal::AssertHelper::operator=(local_2f0,local_2e8);
        testing::internal::AssertHelper::~AssertHelper(local_2f0);
        std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
        testing::Message::~Message(local_2e8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        local_328 = 2;
        pvVar3 = SamplingStatus::tags((SamplingStatus *)local_60);
        local_330 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                              (pvVar3);
        testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
                  ((EqHelper<false> *)local_320,"sizeof(testProbablisticExpectedTags) / sizeof(Tag)"
                   ,"(result.tags()).size()",&local_328,&local_330);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_320);
        if (!bVar1) {
          testing::Message::Message(local_338);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_320);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i_1,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x7c,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,local_338);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
          testing::Message::~Message(local_338);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_320);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          local_348 = 0;
          while( true ) {
            pvVar3 = SamplingStatus::tags((SamplingStatus *)local_60);
            sVar4 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::size
                              (pvVar3);
            if (sVar4 <= local_348) break;
            thrift::Tag::Tag(local_3d8);
            thrift::Tag::Tag((Tag *)&gtest_ar_3.message_);
            jaegertracing::Tag::thrift
                      ((Tag *)((anonymous_namespace)::testProbablisticExpectedTags +
                              local_348 * 0x48));
            pvVar3 = SamplingStatus::tags((SamplingStatus *)local_60);
            pvVar5 = std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::
                     operator[](pvVar3,local_348);
            jaegertracing::Tag::thrift((Tag *)pvVar5);
            testing::internal::EqHelper<false>::
            Compare<jaegertracing::thrift::Tag,jaegertracing::thrift::Tag>
                      ((EqHelper<false> *)local_478,"thriftTagArr","thriftTagVec",local_3d8,
                       (Tag *)&gtest_ar_3.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
            if (!bVar1) {
              testing::Message::Message(local_480);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_478);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)
                         &sampler_1._tags.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                         ,0x7c,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)
                         &sampler_1._tags.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,local_480);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)
                         &sampler_1._tags.
                          super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              testing::Message::~Message(local_480);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              gtest_ar.message_.ptr_._4_4_ = 0;
            }
            jaegertracing::thrift::Tag::~Tag((Tag *)&gtest_ar_3.message_);
            jaegertracing::thrift::Tag::~Tag(local_3d8);
            if (gtest_ar.message_.ptr_._4_4_ != 0) goto LAB_00300200;
            local_348 = local_348 + 1;
          }
          gtest_ar.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
LAB_00300200:
  SamplingStatus::~SamplingStatus((SamplingStatus *)local_60);
  ProbabilisticSampler::~ProbabilisticSampler
            ((ProbabilisticSampler *)
             &result._tags.
              super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    ProbabilisticSampler::ProbabilisticSampler
              ((ProbabilisticSampler *)
               &result_1._tags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,1.0);
    TraceID::TraceID(&local_4e8,0,0x8000000000000000);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_508,"op",(allocator *)((long)&gtest_ar__2.message_.ptr_ + 7));
    ProbabilisticSampler::isSampled
              ((SamplingStatus *)local_4d8,
               (ProbabilisticSampler *)
               &result_1._tags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_4e8,&local_508);
    std::__cxx11::string::~string((string *)&local_508);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__2.message_.ptr_ + 7));
    local_521 = SamplingStatus::isSampled((SamplingStatus *)local_4d8);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_520,&local_521,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
    if (!bVar1) {
      testing::Message::Message(local_530);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_558,local_520,"result.isSampled()","false");
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (local_538,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x82,pcVar2);
      testing::internal::AssertHelper::operator=(local_538,local_530);
      testing::internal::AssertHelper::~AssertHelper(local_538);
      std::__cxx11::string::~string((string *)local_558);
      testing::Message::~Message(local_530);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      TraceID::TraceID(&local_588,0,0x7fffffffffffffec);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_5a8,"op",(allocator *)((long)&gtest_ar__3.message_.ptr_ + 7));
      ProbabilisticSampler::isSampled
                (&local_578,
                 (ProbabilisticSampler *)
                 &result_1._tags.
                  super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_588,&local_5a8);
      SamplingStatus::operator=((SamplingStatus *)local_4d8,&local_578);
      SamplingStatus::~SamplingStatus(&local_578);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__3.message_.ptr_ + 7));
      local_5c1 = SamplingStatus::isSampled((SamplingStatus *)local_4d8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_5c0,&local_5c1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5c0);
      if (!bVar1) {
        testing::Message::Message(local_5d0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (local_5f8,local_5c0,"result.isSampled()","false");
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (local_5d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x86,pcVar2);
        testing::internal::AssertHelper::operator=(local_5d8,local_5d0);
        testing::internal::AssertHelper::~AssertHelper(local_5d8);
        std::__cxx11::string::~string((string *)local_5f8);
        testing::Message::~Message(local_5d0);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5c0);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        gtest_ar.message_.ptr_._4_4_ = 0;
      }
    }
    SamplingStatus::~SamplingStatus((SamplingStatus *)local_4d8);
    ProbabilisticSampler::~ProbabilisticSampler
              ((ProbabilisticSampler *)
               &result_1._tags.
                super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSampler)
{
    {
        ProbabilisticSampler sampler(0.5);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID + 10), kTestOperationName);
        ASSERT_FALSE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
        CMP_TAGS(testProbablisticExpectedTags, result.tags());
    }
    {
        ProbabilisticSampler sampler(1.0);
        auto result =
            sampler.isSampled(TraceID(0, kTestMaxID), kTestOperationName);
        ASSERT_TRUE(result.isSampled());

        result =
            sampler.isSampled(TraceID(0, kTestMaxID - 20), kTestOperationName);
        ASSERT_TRUE(result.isSampled());
    }
}